

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall
Glucose::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Glucose::Lit> *out_clause)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  Clause *pCVar9;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  pCVar9 = _qs;
  if (*(int *)&(_ps->header).field_0x4 < *(int *)&(_qs->header).field_0x4) {
    pCVar9 = _ps;
    _ps = _qs;
  }
  iVar1 = *(int *)&(pCVar9->header).field_0x4;
  bVar8 = iVar1 < 1;
  local_38 = in_RAX;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      uVar2 = *(uint *)(&pCVar9[1].header.field_0x0 + lVar7 * 4);
      if ((int)uVar2 >> 1 != v) {
        uVar6 = 5;
        if (0 < (int)(*(ulong *)&_ps->header >> 0x20)) {
          uVar5 = 0;
          do {
            uVar3 = *(uint *)(&_ps[1].header.field_0x0 + uVar5 * 4);
            if ((int)uVar3 >> 1 == (int)uVar2 >> 1) {
              uVar6 = uVar3 ^ uVar2;
              if (uVar6 != 1) {
                uVar6 = 8;
              }
              break;
            }
            uVar5 = uVar5 + 1;
          } while (*(ulong *)&_ps->header >> 0x20 != uVar5);
        }
        if (uVar6 != 8) {
          if (uVar6 != 5) {
            return bVar8;
          }
          local_38 = CONCAT44(uVar2,local_38._0_4_);
          vec<Glucose::Lit>::push(out_clause,(Lit *)((long)&local_38 + 4));
        }
      }
      lVar7 = lVar7 + 1;
      lVar4 = (long)*(int *)&(pCVar9->header).field_0x4;
      bVar8 = lVar4 <= lVar7;
    } while (lVar7 < lVar4);
  }
  if (0 < *(int *)&(_ps->header).field_0x4) {
    lVar7 = 0;
    do {
      iVar1 = *(int *)(&_ps[1].header.field_0x0 + lVar7 * 4);
      if (iVar1 >> 1 != v) {
        local_38 = CONCAT44(local_38._4_4_,iVar1);
        vec<Glucose::Lit>::push(out_clause,(Lit *)&local_38);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)&(_ps->header).field_0x4);
  }
  return bVar8;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i]))
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}